

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

int __thiscall Parse::varDeclarationList(Parse *this)

{
  value_type vVar1;
  DelimiterTable *pDVar2;
  SymbolTable *this_00;
  Type TVar3;
  uint uVar4;
  reference pvVar5;
  mapped_type *pmVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  ostream *poVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  allocator local_259;
  key_type local_258;
  string local_238;
  string local_218;
  uint local_1f4;
  undefined1 local_1f0 [4];
  int ind;
  string local_1d0;
  undefined1 local_1b0 [8];
  ArrayInfo arrayInfoEle;
  key_type local_170;
  string local_150;
  byte local_12b;
  byte local_12a;
  allocator local_129;
  key_type local_128;
  int local_104;
  byte local_fd;
  int arrLen;
  undefined1 auStack_f8 [3];
  bool arrayFlag;
  int symind;
  size_type sStack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  string local_a0;
  int local_7c;
  undefined1 local_78 [4];
  int stIndex;
  string curName;
  allocator local_41;
  key_type local_40;
  int local_1c;
  Parse *pPStack_18;
  int index;
  Parse *this_local;
  
  local_1c = this->curIndex;
  pPStack_18 = this;
  pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                     (this->tokenVec,(long)this->curIndex);
  curName.field_2._M_local_buf[0xb] = '\0';
  bVar13 = pvVar5->type == DELIMTER;
  bVar14 = false;
  if (bVar13) {
    pDVar2 = this->delimiterTable;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,",",&local_41);
    curName.field_2._M_local_buf[0xb] = '\x01';
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pDVar2->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_40);
    iVar12 = *pmVar6;
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    bVar14 = iVar12 == pvVar5->id;
  }
  if ((curName.field_2._M_local_buf[0xb] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (bVar13) {
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  if (bVar14) {
    this->curIndex = this->curIndex + 1;
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    if (pvVar5->type != IDENTIFIER) {
      poVar11 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2177c);
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,pvVar5->line);
      poVar11 = std::operator<<(poVar11,anon_var_dwarf_217a0);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    std::__cxx11::string::string((string *)local_78,(string *)&pvVar5->name);
    local_7c = 0;
    this_00 = this->st;
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    std::__cxx11::string::string((string *)&local_a0,(string *)&pvVar5->name);
    local_7c = SymbolTable::searchSymbolName(this_00,&local_a0,this->curFun);
    std::__cxx11::string::~string((string *)&local_a0);
    if (-1 < local_7c) {
      poVar11 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_60630 + 3);
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar11 = std::operator<<(poVar11,(string *)&pvVar5->name);
      poVar11 = std::operator<<(poVar11,anon_var_dwarf_217cc);
      poVar11 = std::operator<<(poVar11,anon_var_dwarf_21ad4 + 0x16);
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,pvVar5->line);
      poVar11 = std::operator<<(poVar11,anon_var_dwarf_217a0);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    this->curSymInd = this->curSymInd + 1;
    pvVar7 = std::
             vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
             ::operator[](&this->st->symbolTable,(long)this->curFun);
    local_b8 = 0.0;
    uStack_b0._0_1_ = false;
    uStack_b0._1_1_ = false;
    uStack_b0._2_6_ = 0;
    local_c8._0_4_ = 0;
    local_c8._4_4_ = 0;
    uStack_c0._0_4_ = 0;
    uStack_c0._4_4_ = 0;
    local_d8._0_4_ = 0;
    local_d8._4_4_ = 0;
    uStack_d0._0_4_ = 0;
    uStack_d0._4_4_ = 0;
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = 0;
    auStack_f8[0] = (_Alloc_hider)0x0;
    stack0xffffffffffffff09 = 0;
    sStack_f0 = 0;
    SymbolTableElement::SymbolTableElement((SymbolTableElement *)auStack_f8);
    std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::
    emplace_back<SymbolTableElement>(pvVar7,(SymbolTableElement *)auStack_f8);
    SymbolTableElement::~SymbolTableElement((SymbolTableElement *)auStack_f8);
    pvVar7 = std::
             vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
             ::operator[](&this->st->symbolTable,(long)this->curFun);
    sVar8 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::size(pvVar7);
    arrLen = (int)sVar8 + -1;
    pvVar7 = std::
             vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
             ::operator[](&this->st->symbolTable,(long)this->curFun);
    pvVar9 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                       (pvVar7,(long)arrLen);
    std::__cxx11::string::operator=((string *)pvVar9,(string *)local_78);
    pvVar7 = std::
             vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
             ::operator[](&this->st->symbolTable,(long)this->curFun);
    pvVar9 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                       (pvVar7,(long)arrLen);
    pvVar9->cat = VARIABLE;
    local_fd = 0;
    this->curIndex = this->curIndex + 1;
    local_104 = 0;
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    local_12a = 0;
    local_12b = 0;
    bVar14 = false;
    if (pvVar5->type == DELIMTER) {
      pDVar2 = this->delimiterTable;
      std::allocator<char>::allocator();
      local_12a = 1;
      std::__cxx11::string::string((string *)&local_128,"[",&local_129);
      local_12b = 1;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(pDVar2->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&local_128);
      iVar12 = *pmVar6;
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      bVar14 = iVar12 == pvVar5->id;
    }
    if ((local_12b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_128);
    }
    if ((local_12a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
    }
    if (bVar14) {
      this->curIndex = this->curIndex + 1;
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      if (pvVar5->type != INTCONST) {
        poVar11 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21802);
        pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           (this->tokenVec,(long)this->curIndex);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,pvVar5->line);
        poVar11 = std::operator<<(poVar11,anon_var_dwarf_217a0);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      std::__cxx11::string::string((string *)&local_150,(string *)&pvVar5->name);
      local_104 = string2num<int>(&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      this->curIndex = this->curIndex + 1;
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      arrayInfoEle.clen._2_1_ = 0;
      arrayInfoEle.clen._1_1_ = 0;
      bVar14 = false;
      if (pvVar5->type == DELIMTER) {
        pDVar2 = this->delimiterTable;
        std::allocator<char>::allocator();
        arrayInfoEle.clen._2_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_170,"]",(allocator *)((long)&arrayInfoEle.clen + 3));
        arrayInfoEle.clen._1_1_ = 1;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&(pDVar2->
                               super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).index,&local_170);
        iVar12 = *pmVar6;
        pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           (this->tokenVec,(long)this->curIndex);
        bVar14 = iVar12 == pvVar5->id;
      }
      if ((arrayInfoEle.clen._1_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_170);
      }
      if ((arrayInfoEle.clen._2_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&arrayInfoEle.clen + 3));
      }
      if (!bVar14) {
        poVar11 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21822);
        pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           (this->tokenVec,(long)this->curIndex);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,pvVar5->line);
        poVar11 = std::operator<<(poVar11,anon_var_dwarf_217a0);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      this->curIndex = this->curIndex + 1;
      local_fd = 1;
    }
    if ((local_fd & 1) == 0) {
      std::vector<QuadTuple,std::allocator<QuadTuple>>::
      emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string&,char_const(&)[3]>
                ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,(char (*) [7])"vardef"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &this->curType,(char (*) [3])"--");
      std::__cxx11::string::string((string *)&local_218,(string *)&this->curType);
      TVar3 = toType(this,&local_218);
      pvVar7 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar9 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar7,(long)arrLen);
      pvVar9->type = TVar3;
      std::__cxx11::string::~string((string *)&local_218);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->st->vallVec,(long)this->curFun);
      vVar1 = *pvVar10;
      pvVar7 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar9 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar7,(long)arrLen);
      pvVar9->vall = vVar1;
      std::__cxx11::string::string((string *)&local_238,(string *)&this->curType);
      uVar4 = typeSize(this,&local_238);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->st->vallVec,(long)this->curFun);
      *pvVar10 = uVar4 + *pvVar10;
      std::__cxx11::string::~string((string *)&local_238);
    }
    else {
      std::vector<QuadTuple,std::allocator<QuadTuple>>::
      emplace_back<char_const(&)[7],std::__cxx11::string&,char_const(&)[4],char_const(&)[3]>
                ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,(char (*) [7])"vardef"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (char (*) [4])"arr",(char (*) [3])"__");
      local_1b0._0_4_ = 0;
      local_1b0._4_4_ = 0;
      arrayInfoEle.activeMess.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      arrayInfoEle.activeMess.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
      arrayInfoEle.activeMess.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      arrayInfoEle.low = 0;
      arrayInfoEle.up = 0;
      arrayInfoEle.activeMess.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      arrayInfoEle.activeMess.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      arrayInfoEle.activeMess.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&arrayInfoEle);
      arrayInfoEle.activeMess.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage._0_4_ = 0;
      arrayInfoEle.activeMess.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage._4_4_ = 0;
      local_1b0._0_4_ = 0;
      std::__cxx11::string::string((string *)&local_1d0,(string *)&this->curType);
      arrayInfoEle.activeMess.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage._0_4_ = toType(this,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      local_1b0._4_4_ = local_104 - 1;
      std::__cxx11::string::string((string *)local_1f0,(string *)&this->curType);
      arrayInfoEle.activeMess.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage._4_4_ = typeSize(this,(string *)local_1f0);
      std::__cxx11::string::~string((string *)local_1f0);
      for (local_1f4 = local_1b0._0_4_; local_1f4 <= (uint)local_1b0._4_4_;
          local_1f4 = local_1f4 + 1) {
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)&arrayInfoEle,true);
      }
      std::vector<ArrayInfo,_std::allocator<ArrayInfo>_>::push_back
                (&this->st->arrayTableVec,(value_type *)local_1b0);
      pvVar7 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar9 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar7,(long)arrLen);
      pvVar9->type = ARRAY;
      sVar8 = std::vector<ArrayInfo,_std::allocator<ArrayInfo>_>::size(&this->st->arrayTableVec);
      pvVar7 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar9 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar7,(long)arrLen);
      pvVar9->aiInd = (int)sVar8 + -1;
      iVar12 = arrayInfoEle.activeMess.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_end_of_storage._4_4_ * local_104;
      pvVar7 = std::
               vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ::operator[](&this->st->symbolTable,(long)this->curFun);
      pvVar9 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::operator[]
                         (pvVar7,(long)arrLen);
      pvVar9->len = iVar12;
      ArrayInfo::~ArrayInfo((ArrayInfo *)local_1b0);
    }
    varDeclarationList(this);
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (this->tokenVec,(long)this->curIndex);
    bVar14 = false;
    if (pvVar5->type == DELIMTER) {
      pDVar2 = this->delimiterTable;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_258,anon_var_dwarf_21880 + 0x12,&local_259);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&(pDVar2->
                             super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).index,&local_258);
      iVar12 = *pmVar6;
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      bVar14 = iVar12 == pvVar5->id;
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
    }
    if (!bVar14) {
      poVar11 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21880);
      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (this->tokenVec,(long)this->curIndex);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,pvVar5->line);
      poVar11 = std::operator<<(poVar11,anon_var_dwarf_217a0);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    this->curIndex = this->curIndex + 1;
  }
  return 1;
}

Assistant:

int Parse::varDeclarationList() {
    int index = curIndex;
    if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[","] == tokenVec[curIndex].id) {
        curIndex++;
            if(tokenVec[curIndex].type != TokenType::IDENTIFIER) {
                cout << "类型声明后必须跟着标识符在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            string curName = tokenVec[curIndex].name;
            int stIndex = 0;
            stIndex = st.searchSymbolName(tokenVec[curIndex].name, curFun);
            if(stIndex >= 0) {
//            cout << tokenVec[curIndex].name << endl;
                cout << "变量"<<  tokenVec[curIndex].name <<"重定义" << "在第" << tokenVec[curIndex].line  << "行" << endl;
                exit(0);
            }

            curSymInd++;
            st.symbolTable[curFun].emplace_back(SymbolTableElement());
            int symind = static_cast<int>(st.symbolTable[curFun].size() - 1);
            st.symbolTable[curFun][symind].name = curName;
            st.symbolTable[curFun][symind].cat = Category::VARIABLE;


            bool arrayFlag = false;
            curIndex++;
            int arrLen = 0;

            if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["["] == tokenVec[curIndex].id) {
                curIndex++;
                if(tokenVec[curIndex].type ==  INTCONST) {
                    arrLen = string2num<int >(tokenVec[curIndex].name);
                    curIndex++;
                } else {
                    cout << "数组长度必须是整型变量在第" << tokenVec[curIndex].line << "行" << endl;
                    exit(0);
                }
                if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["]"] == tokenVec[curIndex].id) {
                    curIndex++;
                } else {
                    cout << "数组声明缺少右括号在第" << tokenVec[curIndex].line << "行" << endl;
                    exit(0);
                }
                arrayFlag = true;
            }
            if(arrayFlag) {
                quadVec.emplace_back("vardef", curName, "arr", "__");
                ArrayInfo arrayInfoEle{};
                arrayInfoEle.low = 0;
                arrayInfoEle.type = toType(curType);
                arrayInfoEle.up = static_cast<unsigned int>(arrLen - 1);
                arrayInfoEle.clen = typeSize(curType);
                for(int ind = arrayInfoEle.low ; ind <= arrayInfoEle.up; ind++) {
                    arrayInfoEle.activeMess.push_back(true);
                }
                st.arrayTableVec.push_back(arrayInfoEle);
                st.symbolTable[curFun][symind].type = ARRAY;
                st.symbolTable[curFun][symind].aiInd = static_cast<int>(st.arrayTableVec.size() - 1);
                st.symbolTable[curFun][symind].len = arrayInfoEle.clen * arrLen;
            }else {
                quadVec.emplace_back("vardef", curName, curType, "--");
                st.symbolTable[curFun][symind].type = toType(curType);
                st.symbolTable[curFun][symind].vall = st.vallVec[curFun];
                st.vallVec[curFun] += typeSize(curType);
            }
            varDeclarationList();
    } else if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[";"] == tokenVec[curIndex].id) {
        curIndex++;
        return 1;
    } else {
        cout << "变量声明缺少;" << tokenVec[curIndex].line  << "行" << endl;
        exit(0);
    }
    return 1;
}